

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O1

SuffixTreeInternalNode * __thiscall wasm::SuffixTree::insertRoot(SuffixTree *this)

{
  SuffixTreeInternalNode *pSVar1;
  SuffixTreeInternalNode *pSVar2;
  
  pSVar2 = (SuffixTreeInternalNode *)
           llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                     (&(this->InternalNodeAllocator).Allocator,0x58,(Align)0x3);
  pSVar1 = this->Root;
  (pSVar2->super_SuffixTreeNode)._vptr_SuffixTreeNode = (_func_int **)&PTR_getEndIdx_01097650;
  (pSVar2->super_SuffixTreeNode).Kind = ST_Internal;
  (pSVar2->super_SuffixTreeNode).StartIdx = 0xffffffff;
  *(undefined8 *)&(pSVar2->super_SuffixTreeNode).ConcatLen = 0xffffffff00000000;
  pSVar2->Link = pSVar1;
  (pSVar2->Children)._M_h._M_buckets = &(pSVar2->Children)._M_h._M_single_bucket;
  (pSVar2->Children)._M_h._M_bucket_count = 1;
  (pSVar2->Children)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pSVar2->Children)._M_h._M_element_count = 0;
  (pSVar2->Children)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pSVar2->Children)._M_h._M_rehash_policy._M_next_resize = 0;
  (pSVar2->Children)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return pSVar2;
}

Assistant:

SuffixTreeInternalNode* SuffixTree::insertRoot() {
  return insertInternalNode(/*Parent = */ nullptr,
                            SuffixTreeNode::EmptyIdx,
                            SuffixTreeNode::EmptyIdx,
                            /*Edge = */ 0);
}